

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O1

void __thiscall GameTitle::drawBorder(GameTitle *this,Screen *screen,int color)

{
  pointer pcVar1;
  int iVar2;
  int iVar3;
  uint y;
  int iVar4;
  bool bVar5;
  bool bVar6;
  string character;
  string startMessage;
  undefined1 *local_1e8;
  long local_1e0;
  undefined1 local_1d8 [16];
  ulong local_1c8;
  ulong local_1c0;
  undefined1 *local_1b8;
  long local_1b0;
  undefined1 local_1a8 [20];
  int local_194;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  Screen::clearScreen(screen);
  local_1e8 = local_1d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8," ","");
  local_1b8 = local_1a8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1b8,"<Press Enter to Start Game>","");
  refresh();
  if (_stdscr == 0) {
    iVar2 = -1;
  }
  else {
    iVar2 = *(short *)(_stdscr + 4) + 1;
  }
  screen->screenSize[0] = iVar2;
  iVar2 = screen->screenSize[0];
  refresh();
  if (_stdscr == 0) {
    iVar3 = -1;
  }
  else {
    iVar3 = *(short *)(_stdscr + 6) + 1;
  }
  screen->screenSize[1] = iVar3;
  iVar3 = screen->screenSize[1];
  local_1c8 = (this->title)._M_string_length;
  pcVar1 = (this->title)._M_dataplus._M_p;
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,pcVar1,pcVar1 + local_1c8);
  y = iVar2 / 2;
  local_1c0 = (ulong)y;
  iVar2 = iVar3 / 2 - ((int)(((uint)(local_1c8 >> 0x1f) & 1) + (int)local_1c8) >> 1);
  Screen::printString(screen,&local_70,y,iVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_1e8,local_1e8 + local_1e0);
  local_194 = (int)local_1c0 + -1;
  Screen::printString(screen,&local_90,local_194,iVar2 + -1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  Screen::refreshScreen(screen);
  usleep(0x5161);
  local_1c8 = (ulong)((int)local_1c8 - 1);
  iVar3 = 0;
  bVar5 = false;
  do {
    local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_d0,local_1e8,local_1e8 + local_1e0);
    Screen::printString(screen,&local_d0,local_194,iVar2 + iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
      operator_delete(local_d0._M_dataplus._M_p);
    }
    Screen::refreshScreen(screen);
    usleep(0x5161);
    if ((int)local_1c8 == iVar3) {
      bVar5 = true;
    }
    iVar3 = iVar3 + 1;
  } while (!bVar5);
  local_1c8 = CONCAT44(local_1c8._4_4_,iVar2 + iVar3);
  iVar4 = -1;
  bVar5 = false;
  do {
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    pcVar1 = (this->title)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_f0,pcVar1,pcVar1 + (this->title)._M_string_length);
    Screen::printString(screen,&local_f0,(int)local_1c0,iVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p);
    }
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_110,local_1e8,local_1e8 + local_1e0);
    Screen::printString(screen,&local_110,(int)local_1c0 + iVar4,(int)local_1c8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p);
    }
    Screen::refreshScreen(screen);
    usleep(0x5161);
    if (iVar4 == 0) {
      bVar5 = true;
    }
    iVar4 = iVar4 + 1;
  } while (!bVar5);
  local_1c8 = CONCAT44(local_1c8._4_4_,(int)local_1c0 + iVar4);
  bVar5 = false;
  do {
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    pcVar1 = (this->title)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_130,pcVar1,pcVar1 + (this->title)._M_string_length);
    Screen::printString(screen,&local_130,(int)local_1c0,iVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_150,local_1e8,local_1e8 + local_1e0);
    Screen::printString(screen,&local_150,(int)local_1c8,iVar2 + iVar3);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p);
    }
    Screen::refreshScreen(screen);
    usleep(0x5161);
    bVar6 = iVar3 == 0;
    iVar3 = iVar3 + -1;
    if (bVar6) {
      bVar5 = true;
    }
  } while (!bVar5);
  bVar5 = false;
  do {
    local_170._M_dataplus._M_p = (pointer)&local_170.field_2;
    pcVar1 = (this->title)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar1,pcVar1 + (this->title)._M_string_length);
    Screen::printString(screen,&local_170,(int)local_1c0,iVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170._M_dataplus._M_p != &local_170.field_2) {
      operator_delete(local_170._M_dataplus._M_p);
    }
    local_190._M_dataplus._M_p = (pointer)&local_190.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_190,local_1e8,local_1e8 + local_1e0);
    Screen::printString(screen,&local_190,(int)local_1c0 + iVar4,iVar3 + iVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_190._M_dataplus._M_p != &local_190.field_2) {
      operator_delete(local_190._M_dataplus._M_p);
    }
    Screen::refreshScreen(screen);
    usleep(0x5161);
    bVar6 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar6) {
      bVar5 = true;
    }
  } while (!bVar5);
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char*>((string *)&local_b0,local_1b8,local_1b8 + local_1b0);
  Screen::printString(screen,&local_b0,(int)local_1c0 + 4,iVar2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  Screen::refreshScreen(screen);
  Screen::getInput_abi_cxx11_(&local_50,screen);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_1b8 != local_1a8) {
    operator_delete(local_1b8);
  }
  if (local_1e8 != local_1d8) {
    operator_delete(local_1e8);
  }
  return;
}

Assistant:

void GameTitle::drawBorder(Screen &screen, int color) {
    screen.clearScreen();
    std::string character = " ";
    std::string startMessage = "<Press Enter to Start Game>";

    // Calculate the text location
    int textStartLocation[2];
    textStartLocation[0] = screen.getScreenSizeY() / 2;
    textStartLocation[1] = (screen.getScreenSizeX() / 2) - (static_cast<int>(title.length()) / 2);

    // Calculate the border dimensions
    int borderHeight = 2;
    int borderWidth = static_cast<int>(title.length()) + 1;

    int borderStartLocation[2];
    int borderCursor[2];

    borderStartLocation[0] = borderCursor[0] = textStartLocation[0] - 1;
    borderStartLocation[1] = borderCursor[1] = textStartLocation[1] - 1;

    // Draw the border
    screen.printString(title, textStartLocation[0], textStartLocation[1]);
    screen.printString(character, borderStartLocation[0], borderStartLocation[1]);
    screen.refreshScreen();
    usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

    borderCursor[1]++;

    bool lineFinished = false;

    while(!lineFinished){
        // Print the border
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[1]++;

        if(borderCursor[1] == (borderStartLocation[1] + borderWidth)){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[0]++;

        if(borderCursor[0] == (borderStartLocation[0] + borderHeight)){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[1]--;

        if(borderCursor[1] == borderStartLocation[1]){
            lineFinished = true;
        }
    }

    lineFinished = false;
    while(!lineFinished){
        // Print the border
        screen.printString(title, textStartLocation[0], textStartLocation[1]);
        screen.printString(character, borderCursor[0], borderCursor[1]);
        screen.refreshScreen();
        usleep(MICROSECONDS_PER_SECOND / FRAMES_PER_SECOND / 2);

        // Move the cursor
        borderCursor[0]--;

        if(borderCursor[0] == borderStartLocation[0]){
            lineFinished = true;
        }
    }

    screen.printString(startMessage, textStartLocation[0] + 4, textStartLocation[1]);
    screen.refreshScreen();

    screen.getInput();
}